

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O3

int mutex_lock(mutex_handle *mutex)

{
  pthread_cond_t *__mutex;
  pthread_cond_t *__cond;
  int iVar1;
  
  __cond = (pthread_cond_t *)mutex->priv;
  __mutex = __cond + 1;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    do {
      if (*(int *)((long)__cond + 0x58) == 0) {
        return 0;
      }
      iVar1 = pthread_cond_wait(__cond,(pthread_mutex_t *)__mutex);
    } while (iVar1 == 0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return -iVar1;
}

Assistant:

int mutex_lock(struct mutex_handle *mutex)
{
	struct mutex_priv *priv = mutex->priv;
	int ret;

	ret = pthread_mutex_lock(&priv->lock);
	if (ret != 0)
		return -ret;

	while (priv->readers > 0) {
		ret = pthread_cond_wait(&priv->cond, &priv->lock);
		if (ret != 0) {
			ret = -ret;
			goto mutex_lock_exit;
		}
	}

	return 0;

mutex_lock_exit:
	pthread_mutex_unlock(&priv->lock);

	return ret;
}